

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,__1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *kernel)

{
  Index IVar1;
  undefined8 local_20;
  Index inner;
  Index outer;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,__1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  *kernel_local;
  
  inner = 0;
  while( true ) {
    IVar1 = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
            ::outerSize(kernel);
    if (IVar1 <= inner) break;
    local_20 = 0;
    while( true ) {
      IVar1 = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
              ::innerSize(kernel);
      if (IVar1 <= local_20) break;
      generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
      ::assignCoeffByOuterInner(kernel,inner,local_20);
      local_20 = local_20 + 1;
    }
    inner = inner + 1;
  }
  return;
}

Assistant:

EIGEN_STRONG_INLINE run(Kernel &kernel)
  {
    for(Index outer = 0; outer < kernel.outerSize(); ++outer) {
      for(Index inner = 0; inner < kernel.innerSize(); ++inner) {
        kernel.assignCoeffByOuterInner(outer, inner);
      }
    }
  }